

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O2

void VxSndInit(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *__ptr;
  
  device = (ALCdevice *)alcOpenDevice(0);
  if (device == (ALCdevice *)0x0) {
    __ptr = "Can\'t open audio device!\n";
  }
  else {
    lVar3 = alcCreateContext(device,0);
    if (lVar3 != 0) {
      cVar1 = alcMakeContextCurrent(lVar3);
      if (cVar1 != '\0') {
        cVar1 = alcIsExtensionPresent(device,"ALC_ENUMERATE_ALL_EXT");
        if (cVar1 != '\0') {
          lVar3 = alcGetString(device,0x1013);
          if (lVar3 != 0) {
            iVar2 = alcGetError(device);
            if (iVar2 == 0) goto LAB_0013fa88;
          }
        }
        lVar3 = alcGetString(device,0x1005);
LAB_0013fa88:
        printf("Successfully initialized sound! Device name: %s\n",lVar3);
        return;
      }
      alcDestroyContext(lVar3);
    }
    alcCloseDevice(device);
    __ptr = "Could not set a context!\n";
  }
  fwrite(__ptr,0x19,1,_stderr);
  exit(1);
}

Assistant:

void VxSndInit() {
    ALCcontext* context;
    device = alcOpenDevice(NULL);

    if (!device) {
        fprintf(stderr, "Can't open audio device!\n");
        exit(EXIT_FAILURE);
    }

    context = alcCreateContext(device, NULL);
    if (context == NULL || alcMakeContextCurrent(context) == ALC_FALSE) {
        if (context != NULL)
            alcDestroyContext(context);
        alcCloseDevice(device);
        fprintf(stderr, "Could not set a context!\n");
        exit(EXIT_FAILURE);
    }

    const char* name = NULL;
    if (alcIsExtensionPresent(device, "ALC_ENUMERATE_ALL_EXT"))
        name = alcGetString(device, ALC_ALL_DEVICES_SPECIFIER);
    if (!name || alcGetError(device) != AL_NO_ERROR)
        name = alcGetString(device, ALC_DEVICE_SPECIFIER);

    printf("Successfully initialized sound! Device name: %s\n", name);
}